

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O1

void Corrade::Containers::
     ArrayNewAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::deleter(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,size_t size)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  if (size != 0) {
    pbVar2 = data;
    do {
      pcVar1 = (pbVar2->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2->field_2) {
        operator_delete(pcVar1);
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != data + size);
  }
  operator_delete__((void *)((long)&data[-1].field_2 + 8));
  return;
}

Assistant:

static void deleter(T* data, std::size_t size) {
        for(T *it = data, *end = data + size; it != end; ++it) it->~T();
        deallocate(data);
    }